

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O0

void __thiscall KokkosTools::ChromeTracing::StackNode::print(StackNode *this,ostream *os)

{
  ostream *poVar1;
  uint64_t uVar2;
  Now b;
  ostream *os_local;
  StackNode *this_local;
  
  poVar1 = std::operator<<(os,"{\"name\": \"");
  poVar1 = std::operator<<(poVar1,(string *)this);
  poVar1 = std::operator<<(poVar1,"\", \"cat\": \"");
  poVar1 = operator<<(poVar1,this->kind);
  poVar1 = std::operator<<(poVar1,"\", \"ph\": \"X");
  poVar1 = std::operator<<(poVar1,"\", \"ts\": \"");
  uVar2 = operator-((Now)(this->start_time).impl.__d.__r,(Now)(this->base_time).impl.__d.__r);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1,"\", \"dur\": \"");
  b = now();
  uVar2 = operator-(b,(Now)(this->start_time).impl.__d.__r);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1,"\", \"pid\": \"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->rank);
  poVar1 = std::operator<<(poVar1,"\", \"tid\": \"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\", \"args\": {\"dummy\": 1}}\n");
  return;
}

Assistant:

void print(std::ostream &os) const {
    // {"name": "Asub", "cat": "PERF", "ph": "B", "pid": 22630, "tid": 22630,
    // "ts": 829},
    os << "{\"name\": \"" << name << "\", \"cat\": \"" << kind
       << "\", \"ph\": \"X"
       << "\", \"ts\": \"" << start_time - base_time << "\", \"dur\": \""
       << now() - start_time << "\", \"pid\": \"" << rank << "\", \"tid\": \""
       << 0 << "\", \"args\": {\"dummy\": 1}}\n";
  }